

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall qpdf::Tokenizer::inHexstring2nd(Tokenizer *this,char ch)

{
  byte bVar1;
  state_e sVar2;
  long *plVar3;
  long *plVar4;
  uint uVar5;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  ulong local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  bVar1 = ch - 0x30U;
  if (9 < (byte)(ch - 0x30U)) {
    if (ch < 'a') {
      bVar1 = 0x10;
      if ('@' < ch) {
        bVar1 = ch - 0x37;
      }
    }
    else {
      bVar1 = ch + 0xa9;
    }
  }
  if ((char)bVar1 < '\x10') {
    std::__cxx11::string::push_back((char)this + '\x10');
    sVar2 = st_in_hexstring;
    goto LAB_001e388b;
  }
  uVar5 = (uint)ch;
  if (uVar5 < 0x3f) {
    if ((0x100003e01U >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
      return;
    }
    if ((ulong)uVar5 != 0x3e) goto LAB_001e38d9;
    std::__cxx11::string::push_back((char)this + '\x10');
    this->type = tt_string;
  }
  else {
LAB_001e38d9:
    this->type = tt_bad;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"invalid character (","");
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,'\x01');
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_78 = *plVar4;
      lStack_70 = plVar3[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar4;
      local_88 = (long *)*plVar3;
    }
    local_80 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_38 = *plVar4;
      lStack_30 = plVar3[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar4;
      local_48 = (long *)*plVar3;
    }
    local_40 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->error_message,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  sVar2 = st_token_ready;
LAB_001e388b:
  this->state = sVar2;
  return;
}

Assistant:

void
Tokenizer::inHexstring2nd(char ch)
{
    if (char hval = util::hex_decode_char(ch); hval < '\20') {
        val += char(char_code) | hval;
        state = st_in_hexstring;

    } else if (ch == '>') {
        // PDF spec says odd hexstrings have implicit trailing 0.
        val += char(char_code);
        type = tt::tt_string;
        state = st_token_ready;

    } else if (isSpace(ch)) {
        // ignore

    } else {
        type = tt::tt_bad;
        QTC::TC("qpdf", "QPDFTokenizer bad hexstring 2nd character");
        error_message = std::string("invalid character (") + ch + ") in hexstring";
        state = st_token_ready;
    }
}